

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getSelfPotential(Snapshot *this)

{
  double *pdVar1;
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if ((*(byte *)(in_RDI + 0xa78) & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x720) = 0;
    for (local_c = 0; (int)local_c < 7; local_c = local_c + 1) {
      pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x728),local_c);
      *(double *)(in_RDI + 0x720) = *pdVar1 + *(double *)(in_RDI + 0x720);
    }
    *(undefined1 *)(in_RDI + 0xa78) = 1;
    *(undefined1 *)(in_RDI + 0xa79) = 0;
    *(undefined1 *)(in_RDI + 0xa70) = 0;
  }
  return *(RealType *)(in_RDI + 0x720);
}

Assistant:

RealType Snapshot::getSelfPotential() {
    if (!hasSelfPotential) {
      frameData.selfPotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.selfPotential += frameData.selfPotentials[i];
      }
      hasSelfPotential   = true;
      hasPotentialEnergy = false;
      hasTotalEnergy     = false;
    }
    return frameData.selfPotential;
  }